

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

vector<Patch::Change,_std::allocator<Patch::Change>_> * __thiscall
Patch::grab_changes_in_range<Patch::OldCoordinates>
          (vector<Patch::Change,_std::allocator<Patch::Change>_> *__return_storage_ptr__,Patch *this
          ,Point start,Point end,bool inclusive)

{
  vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *this_00;
  pointer ppNVar1;
  pointer ppNVar2;
  bool bVar3;
  uint32_t uVar4;
  Node *pNVar5;
  Point PVar6;
  pointer ppNVar7;
  pointer pPVar8;
  value_type pNVar9;
  undefined3 in_register_00000081;
  uint32_t uVar10;
  Point new_start;
  Point old_start;
  value_type local_f0;
  PositionStackEntry local_e8;
  vector<Patch::Change,_std::allocator<Patch::Change>_> *local_d0;
  undefined4 local_c4;
  Point local_c0;
  Point local_b8;
  Point local_b0;
  Point local_a8;
  Point local_a0;
  Text *local_98;
  Text *pTStack_90;
  vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> *local_88;
  Point local_80;
  Point local_78;
  value_type local_70;
  
  local_c4 = CONCAT31(in_register_00000081,inclusive);
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0 = __return_storage_ptr__;
  if (this->root != (Node *)0x0) {
    local_a8 = end;
    local_a0 = start;
    pNVar5 = splay_node_starting_before<Patch::OldCoordinates>(this,start);
    ppNVar1 = (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl
        .super__Vector_impl_data._M_finish != ppNVar1) {
      (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppNVar1;
    }
    pPVar8 = (this->left_ancestor_stack).
             super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->left_ancestor_stack).
        super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish != pPVar8) {
      (this->left_ancestor_stack).
      super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = pPVar8;
    }
    Point::Point(&local_78);
    Point::Point(&local_80);
    local_88 = &this->left_ancestor_stack;
    local_70.old_start = local_78;
    local_70.old_end = local_80;
    local_70.new_start.row = 0;
    local_70.new_start.column = 0;
    std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
    emplace_back<Patch::PositionStackEntry>(local_88,(PositionStackEntry *)&local_70);
    this_00 = &this->node_stack;
    local_f0 = this->root;
    if (pNVar5 == (Node *)0x0) {
      for (; local_f0->left != (Node *)0x0; local_f0 = local_f0->left) {
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back(this_00,&local_f0);
      }
    }
    else if (local_f0 == (Node *)0x0) {
      return local_d0;
    }
    do {
      pPVar8 = (this->left_ancestor_stack).
               super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_b0 = Point::traverse(&pPVar8[-1].old_end,&local_f0->old_distance_from_left_ancestor);
      local_b8 = Point::traverse(&pPVar8[-1].new_end,&local_f0->new_distance_from_left_ancestor);
      local_c0 = Point::traverse(&local_b0,&local_f0->old_extent);
      PVar6 = Point::traverse(&local_b8,&local_f0->new_extent);
      local_98 = (local_f0->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
                 _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                 super__Head_base<0UL,_Text_*,_false>._M_head_impl;
      pTStack_90 = (local_f0->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>
                   ._M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                   super__Head_base<0UL,_Text_*,_false>._M_head_impl;
      local_70.old_text_size = Node::old_text_size(local_f0);
      local_70.preceding_old_text_size = pPVar8[-1].total_old_text_size;
      pNVar5 = local_f0->left;
      if (pNVar5 == (Node *)0x0) {
        uVar10 = 0;
      }
      else {
        local_70.preceding_old_text_size =
             local_70.preceding_old_text_size + pNVar5->old_subtree_text_size;
        uVar10 = pNVar5->new_subtree_text_size;
      }
      uVar10 = uVar10 + pPVar8[-1].total_new_text_size;
      local_70.old_start = local_b0;
      local_70.old_end = local_c0;
      local_70.new_start = local_b8;
      local_70.old_text = local_98;
      local_70.new_text = pTStack_90;
      local_98 = (Text *)CONCAT44(local_98._4_4_,local_70.preceding_old_text_size);
      local_70.new_end = PVar6;
      local_70.preceding_new_text_size = uVar10;
      if ((char)local_c4 == '\0') {
        local_e8.old_end = local_b0;
        bVar3 = Point::operator>=(&local_e8.old_end,&local_a8);
        if (bVar3) {
          return local_d0;
        }
        local_e8.old_end = local_70.old_end;
        bVar3 = Point::operator>(&local_e8.old_end,&local_a0);
      }
      else {
        local_e8.old_end = local_b0;
        bVar3 = Point::operator>(&local_e8.old_end,&local_a8);
        if (bVar3) {
          return local_d0;
        }
        local_e8.old_end = local_70.old_end;
        bVar3 = Point::operator>=(&local_e8.old_end,&local_a0);
      }
      if (bVar3 != false) {
        std::vector<Patch::Change,_std::allocator<Patch::Change>_>::push_back(local_d0,&local_70);
      }
      if (local_f0->right == (Node *)0x0) {
        ppNVar1 = (this->node_stack).
                  super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar8 = (this->left_ancestor_stack).
                 super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pNVar9 = local_f0;
        ppNVar2 = (this->node_stack).
                  super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        while( true ) {
          pPVar8 = pPVar8 + -1;
          ppNVar7 = ppNVar2 + -1;
          if (ppNVar2 == ppNVar1) break;
          local_f0 = *ppNVar7;
          pNVar5 = local_f0->right;
          (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppNVar7;
          if (pNVar5 != pNVar9) goto LAB_0015a6b9;
          (this->left_ancestor_stack).
          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish = pPVar8;
          pNVar9 = local_f0;
          ppNVar2 = ppNVar7;
        }
        local_f0 = (Node *)0x0;
      }
      else {
        uVar4 = Node::old_text_size(local_f0);
        local_e8.total_new_text_size = Node::new_text_size(local_f0);
        local_e8.total_old_text_size = uVar4 + (int)local_98;
        local_e8.total_new_text_size = local_e8.total_new_text_size + uVar10;
        local_e8.old_end = local_c0;
        local_e8.new_end = PVar6;
        std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
        emplace_back<Patch::PositionStackEntry>(local_88,&local_e8);
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back(this_00,&local_f0);
        local_f0 = (value_type)&local_f0->right;
        while (local_f0 = local_f0->left, local_f0->left != (Node *)0x0) {
          std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back(this_00,&local_f0);
        }
      }
LAB_0015a6b9:
    } while (local_f0 != (Node *)0x0);
  }
  return local_d0;
}

Assistant:

vector<Change> Patch::grab_changes_in_range(Point start, Point end, bool inclusive) {
  vector<Change> result;
  if (!root)
    return result;

  Node *lower_bound = splay_node_starting_before<CoordinateSpace>(start);

  node_stack.clear();
  left_ancestor_stack.clear();
  left_ancestor_stack.push_back({Point(), Point(), 0, 0});

  Node *node = root;
  if (!lower_bound) {
    while (node->left) {
      node_stack.push_back(node);
      node = node->left;
    }
  }

  while (node) {
    Patch::PositionStackEntry &left_ancestor_info =
        left_ancestor_stack.back();
    Point old_start = left_ancestor_info.old_end.traverse(
        node->old_distance_from_left_ancestor);
    Point new_start = left_ancestor_info.new_end.traverse(
        node->new_distance_from_left_ancestor);

    Point old_end = old_start.traverse(node->old_extent);
    Point new_end = new_start.traverse(node->new_extent);
    Text *old_text = node->old_text.get();
    Text *new_text = node->new_text.get();
    uint32_t old_text_size = node->old_text_size();
    uint32_t preceding_old_text_size =
      left_ancestor_info.total_old_text_size + node->left_subtree_old_text_size();
    uint32_t preceding_new_text_size =
      left_ancestor_info.total_new_text_size + node->left_subtree_new_text_size();
    Change change{
      old_start,
      old_end,
      new_start,
      new_end,
      old_text,
      new_text,
      preceding_old_text_size,
      preceding_new_text_size,
      old_text_size,
    };

    if (inclusive) {
      if (CoordinateSpace::start(change) > end) {
        break;
      }

      if (CoordinateSpace::end(change) >= start) {
        result.push_back(change);
      }
    } else {
      if (CoordinateSpace::start(change) >= end) {
        break;
      }

      if (CoordinateSpace::end(change) > start) {
        result.push_back(change);
      }
    }

    if (node->right) {
      left_ancestor_stack.push_back(Patch::PositionStackEntry{
        old_end,
        new_end,
        preceding_old_text_size + node->old_text_size(),
        preceding_new_text_size + node->new_text_size()
      });
      node_stack.push_back(node);
      node = node->right;

      while (node->left) {
        node_stack.push_back(node);
        node = node->left;
      }
    } else {
      while (!node_stack.empty() && node_stack.back()->right == node) {
        node = node_stack.back();
        node_stack.pop_back();
        left_ancestor_stack.pop_back();
      }

      if (node_stack.empty()) {
        node = nullptr;
      } else {
        node = node_stack.back();
        node_stack.pop_back();
      }
    }
  }

  return result;
}